

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O2

JsErrorCode
JsSetIndexedPropertiesToExternalData
          (JsValueRef object,void *data,JsTypedArrayType arrayType,uint elementLength)

{
  ScriptContext *scriptContext;
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  JsrtContext *pJVar5;
  undefined4 *puVar6;
  RecyclableObject *pRVar7;
  ArrayObject *objArray;
  DynamicObject *this;
  Type typeId;
  JsErrorCode exitStatus;
  void *unaff_retaddr;
  undefined1 auStack_b8 [8];
  ScriptEntryExitRecord __entryExitRecord;
  EnterScriptObject __enterScriptObject;
  TTDRecorder _actionEntryPopper;
  AutoNestedHandledExceptionType local_38;
  uint local_34;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  __enterScriptObject.library = (JavascriptLibrary *)0x0;
  pJVar5 = JsrtContext::GetCurrent();
  if (pJVar5 == (JsrtContext *)0x0) {
    exitStatus = JsErrorNoCurrentContext;
    goto LAB_0036d8a9;
  }
  scriptContext = (((pJVar5->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr
  ;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (&local_38,ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
  __entryExitRecord.frameIdOfScriptExitFunction = (void *)0x0;
  __entryExitRecord.scriptContext = (ScriptContext *)0x0;
  __entryExitRecord.next = (ScriptEntryExitRecord *)0x0;
  __entryExitRecord.returnAddrOfScriptEntryFunction = (void *)0x0;
  __entryExitRecord.addrOfReturnAddrOfScriptEntryFunction = (void *)0x0;
  auStack_b8 = (undefined1  [8])0x0;
  __entryExitRecord._0_1_ = 0;
  __entryExitRecord.savedImplicitCallFlags = ImplicitCall_HasNoInfo;
  __entryExitRecord._2_6_ = 0;
  local_34 = elementLength;
  Js::EnterScriptObject::EnterScriptObject
            ((EnterScriptObject *)&__entryExitRecord.handledExceptionType,scriptContext,
             (ScriptEntryExitRecord *)auStack_b8,unaff_retaddr,&stack0x00000000,true,true,true);
  Js::ScriptContext::OnScriptStart(scriptContext,true,true);
  Js::EnterScriptObject::VerifyEnterScript
            ((EnterScriptObject *)&__entryExitRecord.handledExceptionType);
  if (scriptContext->TTDShouldPerformRecordAction == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                       ,0x9d2,"(false)","Need to implement support here!!!");
    if (!bVar3) goto LAB_0036dc72;
    *puVar6 = 0;
  }
  if (object == (JsValueRef)0x0) {
LAB_0036d891:
    exitStatus = JsErrorInvalidArgument;
  }
  else {
    BVar4 = Js::JavascriptOperators::IsObject(object);
    if (BVar4 != 0) {
      pRVar7 = Js::VarTo<Js::RecyclableObject>(object);
      pSVar1 = (((((pRVar7->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
               scriptContext.ptr;
      if (pSVar1 != scriptContext) {
        exitStatus = JsErrorWrongRuntime;
        if (pSVar1->threadContext != scriptContext->threadContext) goto switchD_0036d87c_default;
        object = Js::CrossSite::MarshalVar(scriptContext,pRVar7,false);
        if (object == (Var)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                             ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
          if (!bVar3) goto LAB_0036dc72;
          *puVar6 = 0;
          object = (Var)0x0;
        }
      }
      bVar3 = Js::TaggedInt::Is(object);
      if (bVar3) {
        typeId = TypeIds_FirstNumberType;
      }
      else if ((ulong)object >> 0x32 == 0) {
        pRVar7 = Js::UnsafeVarTo<Js::RecyclableObject>(object);
        if (pRVar7 == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                             ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar3) goto LAB_0036dc72;
          *puVar6 = 0;
        }
        typeId = ((pRVar7->type).ptr)->typeId;
        if ((0x57 < (int)typeId) && (BVar4 = Js::RecyclableObject::IsExternal(pRVar7), BVar4 == 0))
        {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                             ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                             "GetTypeId aValue has invalid TypeId");
          if (!bVar3) {
LAB_0036dc72:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar6 = 0;
        }
      }
      else {
        typeId = TypeIds_Number;
      }
      bVar3 = Js::DynamicType::Is(typeId);
      if (((bVar3) && (bVar3 = Js::DynamicObject::IsAnyArrayTypeId(typeId), !bVar3)) &&
         (typeId != TypeIds_DataView && 0xd < typeId - TypeIds_ArrayBuffer)) {
        pRVar7 = Js::VarTo<Js::RecyclableObject>(object);
        BVar4 = Js::RecyclableObject::IsExternal(pRVar7);
        if ((BVar4 == 0) && (data != (void *)0x0 || local_34 == 0)) {
          exitStatus = JsErrorInvalidArgument;
          switch(arrayType) {
          case JsArrayTypeInt8:
            objArray = CreateTypedArray<char,false>(scriptContext,data,local_34);
            break;
          case JsArrayTypeUint8:
            objArray = CreateTypedArray<unsigned_char,false>(scriptContext,data,local_34);
            break;
          case JsArrayTypeUint8Clamped:
            objArray = CreateTypedArray<unsigned_char,true>(scriptContext,data,local_34);
            break;
          case JsArrayTypeInt16:
            objArray = CreateTypedArray<short,false>(scriptContext,data,local_34);
            break;
          case JsArrayTypeUint16:
            objArray = CreateTypedArray<unsigned_short,false>(scriptContext,data,local_34);
            break;
          case JsArrayTypeInt32:
            objArray = CreateTypedArray<int,false>(scriptContext,data,local_34);
            break;
          case JsArrayTypeUint32:
            objArray = CreateTypedArray<unsigned_int,false>(scriptContext,data,local_34);
            break;
          case JsArrayTypeFloat32:
            objArray = CreateTypedArray<float,false>(scriptContext,data,local_34);
            break;
          case JsArrayTypeFloat64:
            objArray = CreateTypedArray<double,false>(scriptContext,data,local_34);
            break;
          default:
            goto switchD_0036d87c_default;
          }
          this = Js::VarTo<Js::DynamicObject>(object);
          exitStatus = JsNoError;
          Js::DynamicObject::SetObjectArray(this,objArray);
          goto switchD_0036d87c_default;
        }
      }
      goto LAB_0036d891;
    }
    exitStatus = JsErrorArgumentNotObject;
  }
switchD_0036d87c_default:
  Js::EnterScriptObject::~EnterScriptObject
            ((EnterScriptObject *)&__entryExitRecord.handledExceptionType);
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(&local_38);
LAB_0036d8a9:
  TTD::TTDJsRTActionResultAutoRecorder::CompleteWithStatusCode
            ((TTDJsRTActionResultAutoRecorder *)&__enterScriptObject.library,exitStatus);
  return exitStatus;
}

Assistant:

CHAKRA_API JsSetIndexedPropertiesToExternalData(
    _In_ JsValueRef object,
    _In_ void* data,
    _In_ JsTypedArrayType arrayType,
    _In_ unsigned int elementLength)
{
    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION_NOT_IMPLEMENTED(scriptContext);

        VALIDATE_INCOMING_OBJECT(object, scriptContext);

        // Don't support doing this on array or array-like object
        Js::TypeId typeId = Js::JavascriptOperators::GetTypeId(object);
        if (!Js::DynamicType::Is(typeId)
            || Js::DynamicObject::IsAnyArrayTypeId(typeId)
            || (typeId >= Js::TypeIds_TypedArrayMin && typeId <= Js::TypeIds_TypedArrayMax)
            || typeId == Js::TypeIds_ArrayBuffer
            || typeId == Js::TypeIds_DataView
            || Js::VarTo<Js::RecyclableObject>(object)->IsExternal()
            )
        {
            return JsErrorInvalidArgument;
        }

        if (data == nullptr && elementLength > 0)
        {
            return JsErrorInvalidArgument;
        }

        Js::ArrayObject* newTypedArray = nullptr;
        switch (arrayType)
        {
        case JsArrayTypeInt8:
            newTypedArray = CreateTypedArray<int8>(scriptContext, data, elementLength);
            break;
        case JsArrayTypeUint8:
            newTypedArray = CreateTypedArray<uint8>(scriptContext, data, elementLength);
            break;
        case JsArrayTypeUint8Clamped:
            newTypedArray = CreateTypedArray<uint8, true>(scriptContext, data, elementLength);
            break;
        case JsArrayTypeInt16:
            newTypedArray = CreateTypedArray<int16>(scriptContext, data, elementLength);
            break;
        case JsArrayTypeUint16:
            newTypedArray = CreateTypedArray<uint16>(scriptContext, data, elementLength);
            break;
        case JsArrayTypeInt32:
            newTypedArray = CreateTypedArray<int32>(scriptContext, data, elementLength);
            break;
        case JsArrayTypeUint32:
            newTypedArray = CreateTypedArray<uint32>(scriptContext, data, elementLength);
            break;
        case JsArrayTypeFloat32:
            newTypedArray = CreateTypedArray<float>(scriptContext, data, elementLength);
            break;
        case JsArrayTypeFloat64:
            newTypedArray = CreateTypedArray<double>(scriptContext, data, elementLength);
            break;
        default:
            return JsErrorInvalidArgument;
        }

        Js::DynamicObject* dynamicObject = Js::VarTo<Js::DynamicObject>(object);
        dynamicObject->SetObjectArray(newTypedArray);

        return JsNoError;
    });
}